

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agsmock.h
# Opt level: O0

char * AGSMock::Call<char_const*,SockAddr*>(char *name,SockAddr *args)

{
  code *pcVar1;
  MissingFunction *this;
  char *pcVar2;
  _func_char_ptr_SockAddr_ptr *func;
  void *ptr;
  SockAddr *args_local;
  char *name_local;
  
  pcVar1 = (code *)GetFunction(name);
  if (pcVar1 == (code *)0x0) {
    this = (MissingFunction *)__cxa_allocate_exception(0x10);
    MissingFunction::MissingFunction(this,name);
    __cxa_throw(this,&MissingFunction::typeinfo,MissingFunction::~MissingFunction);
  }
  pcVar2 = (char *)(*pcVar1)(args);
  return pcVar2;
}

Assistant:

T Call(const char *name, Args... args)
{
	void *ptr = GetFunction(name);
	if (ptr == nullptr) throw MissingFunction(name);
	T (*func)(Args...);
	*(reinterpret_cast<void **> (&func)) = ptr;
	return func(args...);
}